

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O1

void compact_array_suite::test_int64_one(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  output_type expected [10];
  undefined1 local_b6 [6];
  int64_t value [1];
  oarchive ar;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&ar,&result);
  value[0] = 0x7fffffffffffffff;
  trial::protocol::bintoken::detail::basic_encoder<16UL>::array(&ar.writer.encoder,value,1);
  expected[8] = 0xff;
  expected[9] = '\x7f';
  expected[0] = 0xae;
  expected[1] = '\b';
  expected[2] = 0xff;
  expected[3] = 0xff;
  expected[4] = 0xff;
  expected[5] = 0xff;
  expected[6] = 0xff;
  expected[7] = 0xff;
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_suite.cpp"
             ,0x210,"void compact_array_suite::test_int64_one()",
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,expected,local_b6);
  ar.super_common_oarchive<trial::protocol::bintoken::oarchive>._0_8_ = &PTR_vsave_00121760;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&ar.writer.stack);
  (**(code **)ar.writer.encoder.storage._0_8_)(&ar.writer);
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)&ar);
  if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    int value = 0;
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
}